

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR iff_stack_push(iff_stack *stack,uint8_t value)

{
  uint8_t *puVar1;
  uint8_t *extraout_RAX;
  size_t sVar2;
  
  sVar2 = stack->index;
  if (sVar2 == stack->size) {
    stack->size = sVar2 + 4;
    puVar1 = (uint8_t *)ly_realloc(stack->stack,sVar2 + 4);
    stack->stack = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","iff_stack_push");
      stack->size = 0;
      puVar1 = extraout_RAX;
      goto LAB_0015113f;
    }
    sVar2 = stack->index;
  }
  else {
    puVar1 = stack->stack;
  }
  stack->index = sVar2 + 1;
  puVar1[sVar2] = value;
LAB_0015113f:
  return (LY_ERR)puVar1;
}

Assistant:

static LY_ERR
iff_stack_push(struct iff_stack *stack, uint8_t value)
{
    if (stack->index == stack->size) {
        stack->size += IFF_STACK_SIZE_STEP;
        stack->stack = ly_realloc(stack->stack, stack->size * sizeof *stack->stack);
        LY_CHECK_ERR_RET(!stack->stack, LOGMEM(NULL); stack->size = 0, LY_EMEM);
    }
    stack->stack[stack->index++] = value;
    return LY_SUCCESS;
}